

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O2

void error_report(Location *location,string *message)

{
  char *text;
  int iVar1;
  reference pvVar2;
  ostream *poVar3;
  
  error_count = error_count + 1;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&srcfile_abi_cxx11_,(long)location->line - 1);
  text = (pvVar2->_M_dataplus)._M_p;
  iVar1 = fprintf(_stderr,"\n%s (%d): ",location->unit,(ulong)(uint)location->line);
  fprintf(_stderr,"%s\n",text);
  underline(iVar1 + -1,location->first_column,location->last_column,text);
  fwrite("\nERROR!\t",8,1,_stderr);
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)message);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void error_report(ast::Location *location, std::string message)
{
	error_count++;
	int lineno =  location->line - 1;
	const char *text = srcfile.at(lineno).c_str();
	auto offset = fprintf(stderr, "\n%s (%d): ", location->unit, location->line) - 1;
	fprintf(stderr, "%s\n", text);
	underline(offset, location->first_column, location->last_column, text);
	fprintf(stderr, "\nERROR!\t");
	std::cerr << message << std::endl;
}